

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManComputeOverlap2(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vVisit;
  int *piVar3;
  Vec_Str_t *vLabel;
  char *__s;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x14b,"int Gia_ManComputeOverlap2(Gia_Man_t *)");
  }
  iVar2 = p->nObjs;
  iVar5 = p->vCos->nSize;
  iVar1 = p->vCis->nSize;
  vVisit = (Vec_Int_t *)malloc(0x10);
  vVisit->nCap = 100;
  vVisit->nSize = 0;
  piVar3 = (int *)malloc(400);
  vVisit->pArray = piVar3;
  vLabel = (Vec_Str_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar4 = iVar2;
  }
  vLabel->nSize = 0;
  vLabel->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar4);
  }
  iVar5 = iVar1 + (iVar5 - iVar2) + 1;
  vLabel->pArray = __s;
  vLabel->nSize = iVar2;
  memset(__s,0,(long)iVar2);
  if (1 < p->nObjs) {
    lVar6 = 1;
    do {
      if (p->vMapping->nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vMapping->pArray[lVar6] != 0) {
        iVar2 = Gia_ManComputeOverlap2One(p,(int)lVar6,vLabel,vVisit);
        iVar5 = iVar5 + iVar2;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nObjs);
  }
  if (vLabel->pArray != (char *)0x0) {
    free(vLabel->pArray);
    vLabel->pArray = (char *)0x0;
  }
  free(vLabel);
  if (vVisit->pArray != (int *)0x0) {
    free(vVisit->pArray);
    vVisit->pArray = (int *)0x0;
  }
  free(vVisit);
  return iVar5;
}

Assistant:

int Gia_ManComputeOverlap2( Gia_Man_t * p )
{
    Vec_Int_t * vVisit;
    Vec_Str_t * vLabel;
    int i, Count = -Gia_ManAndNum(p);
    assert( Gia_ManHasMapping(p) );
    vVisit = Vec_IntAlloc( 100 );
    vLabel = Vec_StrStart( Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
        Count += Gia_ManComputeOverlap2One( p, i, vLabel, vVisit );
    Vec_StrFree( vLabel );
    Vec_IntFree( vVisit );
    return Count;
}